

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result btree_iterator_free(btree_iterator *it)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if (*(long *)(*(long *)(in_RDI + 0x20) + 0x38) != 0) {
    (**(code **)(*(long *)(in_RDI + 0x20) + 0x38))(in_RDI,*(undefined8 *)(in_RDI + 0x38),0);
  }
  free(*(void **)(in_RDI + 0x38));
  free(*(void **)(in_RDI + 0x40));
  free(*(void **)(in_RDI + 0x48));
  for (local_c = 0; local_c < (int)(uint)*(ushort *)(in_RDI + 2); local_c = local_c + 1) {
    if (*(long *)(*(long *)(in_RDI + 0x50) + (long)local_c * 8) != 0) {
      free(*(void **)(*(long *)(in_RDI + 0x58) + (long)local_c * 8));
    }
  }
  free(*(void **)(in_RDI + 0x50));
  free(*(void **)(in_RDI + 0x58));
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_iterator_free(struct btree_iterator *it)
{
    int i;
    if (it->btree.kv_ops->free_kv_var) {
        it->btree.kv_ops->free_kv_var(&it->btree, it->curkey, NULL);
    }
    mempool_free(it->curkey);
    mempool_free(it->bid);
    mempool_free(it->idx);
    for (i=0;i<it->btree.height;++i){
        if (it->node[i]) mempool_free(it->addr[i]);
    }
    mempool_free(it->node);
    mempool_free(it->addr);
    return BTREE_RESULT_SUCCESS;
}